

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::AudioTrack::PayloadSize(AudioTrack *this)

{
  uint64_t uVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 in_RDI;
  Track *unaff_retaddr;
  uint64_t size;
  uint64_t parent_size;
  undefined4 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined8 local_18;
  
  uVar1 = Track::PayloadSize(unaff_retaddr);
  uVar2 = EbmlElementSize(in_RDI,in_stack_ffffffffffffffdc);
  uVar3 = EbmlElementSize(in_RDI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  local_18 = uVar3 + uVar2;
  if (*(long *)(in_RDI + 0x78) != 0) {
    uVar2 = EbmlElementSize(in_RDI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_18 = uVar2 + local_18;
  }
  uVar2 = EbmlMasterElementSize
                    (in_RDI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  return uVar1 + uVar2 + local_18;
}

Assistant:

uint64_t AudioTrack::PayloadSize() const {
  const uint64_t parent_size = Track::PayloadSize();

  uint64_t size = EbmlElementSize(libwebm::kMkvSamplingFrequency,
                                  static_cast<float>(sample_rate_));
  size +=
      EbmlElementSize(libwebm::kMkvChannels, static_cast<uint64>(channels_));
  if (bit_depth_ > 0)
    size +=
        EbmlElementSize(libwebm::kMkvBitDepth, static_cast<uint64>(bit_depth_));
  size += EbmlMasterElementSize(libwebm::kMkvAudio, size);

  return parent_size + size;
}